

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ostream * wasm::String::unescapeUTF8JSONtoWTF16(ostream *os,char *str)

{
  basic_ostream<char,_std::char_traits<char>_> *__os;
  basic_string_view<char,_std::char_traits<char>_> local_4e0;
  Fatal local_4d0;
  stringstream local_348 [8];
  stringstream unhex;
  undefined1 local_338 [376];
  uint32_t local_1c0 [2];
  uint x;
  Fatal local_1b0;
  char local_21;
  long lStack_20;
  char c;
  size_t i;
  char *str_local;
  ostream *os_local;
  
  lStack_20 = 0;
  i = (size_t)str;
  str_local = (char *)os;
  while( true ) {
    while( true ) {
      while( true ) {
        if (*(char *)(i + lStack_20) == '\0') {
          return (ostream *)str_local;
        }
        if (*(char *)(i + lStack_20) == '\\') break;
        writeWTF16CodePoint((ostream *)str_local,(int)*(char *)(i + lStack_20));
        lStack_20 = lStack_20 + 1;
      }
      local_21 = *(char *)(i + 1 + lStack_20);
      if (local_21 == 'u') break;
      if (local_21 == '\0') {
        Fatal::Fatal(&local_1b0);
        Fatal::operator<<(&local_1b0,(char (*) [35])"Invalid escaped JSON ends in slash");
        Fatal::~Fatal(&local_1b0);
      }
      if (local_21 == 'b') {
        local_21 = '\b';
      }
      else if (local_21 == 'f') {
        local_21 = '\f';
      }
      else if (local_21 == 'n') {
        local_21 = '\n';
      }
      else if (local_21 == 'r') {
        local_21 = '\r';
      }
      else if (local_21 == 't') {
        local_21 = '\t';
      }
      writeWTF16CodePoint((ostream *)str_local,(int)local_21);
      lStack_20 = lStack_20 + 2;
    }
    std::__cxx11::stringstream::stringstream(local_348);
    if ((((*(char *)(i + 2 + lStack_20) == '\0') || (*(char *)(i + 3 + lStack_20) == '\0')) ||
        (*(char *)(i + 4 + lStack_20) == '\0')) || (*(char *)(i + 5 + lStack_20) == '\0')) break;
    __os = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_338,std::hex);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4e0,(char *)(i + 2 + lStack_20),4);
    std::operator<<(__os,local_4e0);
    std::istream::operator>>((istream *)local_348,local_1c0);
    writeWTF16CodePoint((ostream *)str_local,local_1c0[0]);
    lStack_20 = lStack_20 + 6;
    std::__cxx11::stringstream::~stringstream(local_348);
  }
  Fatal::Fatal(&local_4d0);
  Fatal::operator<<(&local_4d0,(char (*) [28])"Invalid escaped JSON \\uXXXX");
  Fatal::~Fatal(&local_4d0);
}

Assistant:

std::ostream& unescapeUTF8JSONtoWTF16(std::ostream& os, const char* str) {
  size_t i = 0;
  while (str[i]) {
    if (str[i] != '\\') {
      // Normal character.
      writeWTF16CodePoint(os, str[i]);
      i++;
      continue;
    }

    // Escaped character.
    char c = str[i + 1];
    if (c != 'u') {
      switch (c) {
        case 'b':
          c = '\b';
          break;
        case 'f':
          c = '\f';
          break;
        case 'n':
          c = '\n';
          break;
        case 'r':
          c = '\r';
          break;
        case 't':
          c = '\t';
          break;
        case 0:
          Fatal() << "Invalid escaped JSON ends in slash";
      }
      writeWTF16CodePoint(os, c);
      i += 2;
      continue;
    }

    // \uXXXX, 4-digit hex number. First, read the hex.
    unsigned int x;
    std::stringstream unhex;
    if (!str[i + 2] || !str[i + 3] || !str[i + 4] || !str[i + 5]) {
      Fatal() << "Invalid escaped JSON \\uXXXX";
    }
    unhex << std::hex << std::string_view(str + i + 2, 4);
    unhex >> x;

    // Write out the results.
    writeWTF16CodePoint(os, x);

    i += 6;
  }

  return os;
}